

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O3

ssize_t __thiscall Omega_h::binary::read(binary *this,int __fd,void *__buf,size_t __nbytes)

{
  Library *library_in;
  undefined4 in_register_00000034;
  ScopedTimer timer;
  ScopedTimer local_31;
  undefined8 local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  begin_code("binary::read(path, comm, strict)",(char *)0x0);
  library_in = Comm::library(*__buf);
  Omega_h::Mesh::Mesh((Mesh *)this,library_in);
  local_30 = *__buf;
  local_28 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)__buf + 8);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  read((binary *)CONCAT44(in_register_00000034,__fd),(int)&local_30,this,__nbytes & 0xff);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  ScopedTimer::~ScopedTimer(&local_31);
  return (ssize_t)this;
}

Assistant:

Mesh read(filesystem::path const& path, CommPtr comm, bool strict) {
  ScopedTimer timer("binary::read(path, comm, strict)");
  auto mesh = Mesh(comm->library());
  binary::read(path, comm, &mesh, strict);
  return mesh;
}